

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# callback.h
# Opt level: O0

void __thiscall
booster::callback<void_(const_std::error_code_&,_unsigned_long)>::callback<cancel_once>
          (callback<void_(const_std::error_code_&,_unsigned_long)> *this,cancel_once func)

{
  cancel_once f;
  callable_impl<void,_cancel_once> *this_00;
  stream_socket *in_stack_ffffffffffffffc8;
  intrusive_ptr<booster::callable<void_(const_std::error_code_&,_unsigned_long)>_>
  *in_stack_ffffffffffffffd0;
  
  this_00 = (callable_impl<void,_cancel_once> *)operator_new(0x20);
  f._8_8_ = in_stack_ffffffffffffffd0;
  f.sock = in_stack_ffffffffffffffc8;
  callable_impl<void,_cancel_once>::callable_impl(this_00,f);
  intrusive_ptr<booster::callable<void_(const_std::error_code_&,_unsigned_long)>_>::intrusive_ptr
            (in_stack_ffffffffffffffd0,
             (callable<void_(const_std::error_code_&,_unsigned_long)> *)in_stack_ffffffffffffffc8,
             SUB81((ulong)this_00 >> 0x38,0));
  return;
}

Assistant:

callback(F func) : call_ptr(new callable_impl<Result,F>(func)) 	
		{}